

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiContext *g;
  float *pfVar3;
  uint uVar4;
  bool bVar5;
  ulong idx;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  ImVec2 IVar15;
  double dVar16;
  double dVar17;
  float linear_zero_pos;
  float fVar18;
  float fVar19;
  
  pIVar1 = GImGui;
  idx = (ulong)(flags & 1);
  uVar4 = data_type & 0xfffffffe;
  bVar6 = uVar4 == 8;
  bVar5 = power != 1.0;
  fVar9 = ImVec2::operator[](&bb->Max,idx);
  fVar10 = ImVec2::operator[](&bb->Min,idx);
  fVar10 = (fVar9 - fVar10) + -4.0;
  fVar9 = (pIVar1->Style).GrabMinSize;
  dVar16 = v_max - v_min;
  dVar17 = (double)(~-(ulong)(v_min < v_max) & (ulong)(v_min - v_max) |
                   -(ulong)(v_min < v_max) & (ulong)dVar16);
  if ((uVar4 != 8) && (0.0 <= dVar17)) {
    fVar11 = (float)((double)fVar10 / (dVar17 + 1.0));
    uVar7 = -(uint)(fVar9 <= fVar11);
    fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar11 & uVar7);
  }
  if (fVar10 <= fVar9) {
    fVar9 = fVar10;
  }
  fVar11 = ImVec2::operator[](&bb->Min,idx);
  fVar12 = ImVec2::operator[](&bb->Max,idx);
  if ((!bVar5 || !bVar6) || 0.0 <= v_min * v_max) {
    if (v_min < 0.0) {
      linear_zero_pos = 1.0;
    }
    else {
      linear_zero_pos = 0.0;
    }
  }
  else {
    uVar8 = -(ulong)(-v_min <= v_min);
    dVar13 = pow((double)(uVar8 & (ulong)v_min | ~uVar8 & (ulong)-v_min),1.0 / (double)power);
    uVar8 = -(ulong)(-v_max <= v_max);
    dVar14 = pow((double)(uVar8 & (ulong)v_max | ~uVar8 & (ulong)-v_max),1.0 / (double)power);
    linear_zero_pos = (float)(dVar13 / (dVar14 + dVar13));
  }
  fVar11 = fVar11 + 2.0 + fVar9 * 0.5;
  if (pIVar1->ActiveId != id) {
LAB_00183359:
    bVar5 = false;
    goto LAB_0018335c;
  }
  if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar15 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar19 = IVar15.x;
    if (idx != 0) {
      fVar19 = -IVar15.y;
    }
    if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar19 != 0.0) || (NAN(fVar19))) {
      fVar18 = SliderCalcRatioFromValueT<double,double>
                         (data_type,*v,v_min,v_max,power,linear_zero_pos);
      if ((uVar4 != 8) ||
         (iVar2 = ImParseFormatPrecision(format,3), (bool)(~(bVar5 && bVar6) & iVar2 < 1))) {
        if ((ABS(dVar17) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar19 = *(float *)(&DAT_0018b0d8 + (ulong)(fVar19 < 0.0) * 4) / (float)dVar17;
        }
        else {
          fVar19 = fVar19 / 100.0;
        }
      }
      else {
        fVar19 = fVar19 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar19 = fVar19 / 10.0;
        }
      }
      uVar7 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar19 = (float)(~uVar7 & (uint)fVar19 | (uint)(fVar19 * 10.0) & uVar7);
      if ((1.0 <= fVar18) && (0.0 < fVar19)) {
        bVar5 = false;
        goto LAB_0018335c;
      }
      if ((fVar18 <= 0.0) && (fVar19 < 0.0)) goto LAB_00183359;
      fVar18 = fVar18 + fVar19;
      fVar19 = 1.0;
      if (fVar18 <= 1.0) {
        fVar19 = fVar18;
      }
      fVar19 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar19);
      goto LAB_00182fe8;
    }
    bVar5 = false;
    goto LAB_0018335c;
  }
  if (pIVar1->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00183359;
  if ((pIVar1->IO).MouseDown[0] == false) {
    ClearActiveID();
    bVar5 = false;
    goto LAB_0018335c;
  }
  pfVar3 = ImVec2::operator[](&(pIVar1->IO).MousePos,idx);
  fVar19 = 0.0;
  if (0.0 < fVar10 - fVar9) {
    fVar18 = (*pfVar3 - fVar11) / (fVar10 - fVar9);
    fVar19 = 1.0;
    if (fVar18 <= 1.0) {
      fVar19 = fVar18;
    }
    fVar19 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar19);
  }
  if (idx != 0) {
    fVar19 = 1.0 - fVar19;
  }
LAB_00182fe8:
  if (bVar5 && bVar6) {
    if (linear_zero_pos <= fVar19) {
      uVar4 = -(uint)(1e-06 < ABS(linear_zero_pos + -1.0));
      fVar19 = powf((float)(~uVar4 & (uint)fVar19 |
                           (uint)((fVar19 - linear_zero_pos) / (1.0 - linear_zero_pos)) & uVar4),
                    power);
      dVar17 = (double)(-(ulong)(0.0 <= v_min) & (ulong)v_min);
      dVar13 = (double)fVar19 * (v_max - dVar17);
      goto LAB_0018329e;
    }
    fVar19 = powf(1.0 - fVar19 / linear_zero_pos,power);
    dVar13 = v_max;
    if (0.0 <= v_max) {
      dVar13 = 0.0;
    }
    dVar13 = (double)fVar19 * (v_min - dVar13) + dVar13;
  }
  else {
    dVar17 = v_min;
    if (uVar4 == 8) {
      dVar13 = dVar16 * (double)fVar19;
    }
    else {
      dVar16 = dVar16 * (double)fVar19;
      dVar13 = dVar16 + 0.5;
      if (dVar16 + 0.5 <= dVar16) {
        dVar13 = dVar16;
      }
    }
LAB_0018329e:
    dVar13 = dVar13 + dVar17;
  }
  dVar16 = RoundScalarWithFormatT<double,double>(format,data_type,dVar13);
  if ((*v != dVar16) || (NAN(*v) || NAN(dVar16))) {
    *v = dVar16;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
LAB_0018335c:
  if (1.0 <= fVar10) {
    fVar10 = SliderCalcRatioFromValueT<double,double>
                       (data_type,*v,v_min,v_max,power,linear_zero_pos);
    if (idx != 0) {
      fVar10 = 1.0 - fVar10;
    }
    fVar11 = (((fVar12 + -2.0) - fVar9 * 0.5) - fVar11) * fVar10 + fVar11;
    if (idx == 0) {
      fVar10 = (bb->Min).y;
      fVar12 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar9 * 0.5 + fVar11;
      (out_grab_bb->Min).y = fVar10 + 2.0;
      (out_grab_bb->Max).x = fVar9 * 0.5 + fVar11;
      (out_grab_bb->Max).y = fVar12 + -2.0;
    }
    else {
      fVar10 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar9 * 0.5 + fVar11;
      (out_grab_bb->Max).x = fVar10 + -2.0;
      (out_grab_bb->Max).y = fVar9 * 0.5 + fVar11;
    }
  }
  else {
    IVar15 = bb->Min;
    out_grab_bb->Min = IVar15;
    out_grab_bb->Max = IVar15;
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}